

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int handle_client_handshake_message
              (ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,int is_end_of_record
              ,ptls_handshake_properties_t *properties)

{
  void *__src;
  ptls_key_exchange_context_t **pppVar1;
  ushort *puVar2;
  byte *pbVar3;
  char cVar4;
  undefined1 uVar5;
  uint8_t uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  st_ptls_get_time_t *psVar9;
  st_ptls_on_extension_t *psVar10;
  st_ptls_decompress_certificate_t *psVar11;
  ptls_buffer_t *buf;
  size_t sVar12;
  st_ptls_save_ticket_t *psVar13;
  ptls_key_exchange_context_t *ppVar14;
  st_ptls_aead_context_t *__ptr;
  st_ptls_update_traffic_key_t *psVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ptls_iovec_t pVar18;
  byte bVar19;
  ushort uVar20;
  ushort uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint64_t uVar25;
  uint8_t *puVar26;
  ulong uVar27;
  long lVar28;
  ptls_key_exchange_algorithm_t **pppVar29;
  uint8_t *puVar30;
  uint uVar31;
  ptls_cipher_suite_t **pppVar32;
  ptls_key_exchange_algorithm_t *ppVar33;
  ptls_message_emitter_t *emitter_00;
  ptls_cipher_suite_t *ppVar34;
  uint8_t *puVar35;
  bool bVar36;
  size_t sVar37;
  ptls_key_schedule_t *ppVar38;
  ptls_message_emitter_t *_emitter;
  uint8_t *puVar39;
  undefined4 in_register_00000084;
  ptls_raw_extension_t *ppVar40;
  uint8_t *puVar41;
  ptls_hash_context_t **pppVar42;
  undefined1 *puVar43;
  ptls_raw_extension_t *ppVar44;
  ptls_raw_extension_t *ppVar45;
  size_t sVar46;
  uint8_t *puVar47;
  uint8_t *puVar48;
  undefined1 auVar49 [32];
  ptls_iovec_t pVar50;
  ptls_iovec_t context;
  ptls_iovec_t pVar51;
  ptls_iovec_t message_00;
  ptls_iovec_t pVar52;
  ptls_iovec_t pVar53;
  ptls_iovec_t pVar54;
  ptls_iovec_t pVar55;
  ptls_iovec_t ticket_nonce;
  uint32_t ticket_lifetime;
  ptls_iovec_t ticket;
  uint32_t max_early_data_size;
  uint32_t ticket_age_add;
  ushort local_102;
  uint8_t *local_100;
  uint8_t *local_f8;
  ushort local_e4;
  ptls_raw_extension_t *local_e0;
  ptls_iovec_t local_d8;
  uint8_t *local_c0;
  uint8_t *local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [8];
  undefined1 auStack_a0 [16];
  ulong uStack_90;
  void *local_88;
  uint8_t *puStack_80;
  ulong uStack_78;
  uint8_t *puStack_70;
  ptls_iovec_t local_68;
  uint8_t *local_50;
  ulong local_48;
  void *local_40;
  uint32_t local_38;
  uint32_t local_34;
  
  ppVar40 = (ptls_raw_extension_t *)CONCAT44(in_register_00000084,is_end_of_record);
  puVar30 = (uint8_t *)message.len;
  emitter_00 = (ptls_message_emitter_t *)message.base;
  uVar31 = tls->state - PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO;
  if (0xd < uVar31) {
switchD_001105fb_caseD_8:
    __assert_fail("!\"unexpected state\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0x11da,
                  "int handle_client_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                 );
  }
  cVar4 = *(char *)&emitter_00->buf;
  message_00.len =
       (long)&switchD_001105fb::switchdataD_00130b20 +
       (long)(int)(&switchD_001105fb::switchdataD_00130b20)[uVar31];
  switch(tls->state) {
  case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
  case PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO:
    if (is_end_of_record == 0 || cVar4 != '\x02') {
      return 10;
    }
    local_d8.base = (uint8_t *)0x0;
    local_d8.len = 0;
    local_a8 = (undefined1  [8])0x0;
    auStack_a0 = ZEXT816(0);
    uStack_90 = 0;
    local_88 = (void *)0x0;
    puStack_80 = (uint8_t *)0x0;
    puStack_70 = (uint8_t *)0x0;
    local_68.base = (uint8_t *)0x0;
    if ((long)puVar30 < 0x26) {
      return 0x32;
    }
    uVar7 = *(undefined8 *)((long)&emitter_00->record_header_length + 6);
    auVar16 = vpinsrb_avx(ZEXT416((uint)uVar7),(uint)((ulong)uVar7 >> 8) & 0xffffff,1);
    auVar16 = vpinsrb_avx(auVar16,(uint)((ulong)uVar7 >> 0x10) & 0xffff,2);
    auVar16 = vpinsrb_avx(auVar16,(uint)((ulong)uVar7 >> 0x18) & 0xff,3);
    uVar31 = (uint)((ulong)uVar7 >> 0x20);
    auVar16 = vpinsrb_avx(auVar16,uVar31,4);
    auVar16 = vpinsrb_avx(auVar16,uVar31 >> 8,5);
    auVar16 = vpinsrb_avx(auVar16,(uint)(ushort)((ulong)uVar7 >> 0x30),6);
    auVar16 = vpinsrb_avx(auVar16,(uint)(byte)((ulong)uVar7 >> 0x38),7);
    uVar7 = *(undefined8 *)((long)&emitter_00->begin_message + 6);
    auVar16 = vpinsrb_avx(auVar16,(int)uVar7,8);
    auVar16 = vpinsrb_avx(auVar16,(uint)((ulong)uVar7 >> 8) & 0xffffff,9);
    auVar16 = vpinsrb_avx(auVar16,(uint)((ulong)uVar7 >> 0x10) & 0xffff,10);
    auVar16 = vpinsrb_avx(auVar16,(uint)((ulong)uVar7 >> 0x18) & 0xff,0xb);
    uVar31 = (uint)((ulong)uVar7 >> 0x20);
    auVar16 = vpinsrb_avx(auVar16,uVar31,0xc);
    auVar16 = vpinsrb_avx(auVar16,uVar31 >> 8,0xd);
    auVar16 = vpinsrb_avx(auVar16,(uint)(ushort)((ulong)uVar7 >> 0x30),0xe);
    auVar16 = vpinsrb_avx(auVar16,(uint)(byte)((ulong)uVar7 >> 0x38),0xf);
    uVar7 = *(undefined8 *)((long)&emitter_00->buf + 6);
    uVar8 = *(undefined8 *)((long)&emitter_00->enc + 6);
    auVar17 = vpinsrb_avx(ZEXT416((uint)uVar7),(uint)((ulong)uVar7 >> 8) & 0xffffff,1);
    auVar17 = vpinsrb_avx(auVar17,(uint)((ulong)uVar7 >> 0x10) & 0xffff,2);
    auVar17 = vpinsrb_avx(auVar17,(uint)((ulong)uVar7 >> 0x18) & 0xff,3);
    uVar31 = (uint)((ulong)uVar7 >> 0x20);
    auVar17 = vpinsrb_avx(auVar17,uVar31,4);
    auVar17 = vpinsrb_avx(auVar17,uVar31 >> 8,5);
    auVar17 = vpinsrb_avx(auVar17,(uint)(ushort)((ulong)uVar7 >> 0x30),6);
    auVar17 = vpinsrb_avx(auVar17,(uint)(byte)((ulong)uVar7 >> 0x38),7);
    auVar17 = vpinsrb_avx(auVar17,(int)uVar8,8);
    auVar17 = vpinsrb_avx(auVar17,(uint)((ulong)uVar8 >> 8) & 0xffffff,9);
    auVar17 = vpinsrb_avx(auVar17,(uint)((ulong)uVar8 >> 0x10) & 0xffff,10);
    auVar17 = vpinsrb_avx(auVar17,(uint)((ulong)uVar8 >> 0x18) & 0xff,0xb);
    uVar31 = (uint)((ulong)uVar8 >> 0x20);
    auVar17 = vpinsrb_avx(auVar17,uVar31,0xc);
    auVar17 = vpinsrb_avx(auVar17,uVar31 >> 8,0xd);
    auVar17 = vpinsrb_avx(auVar17,(uint)(ushort)((ulong)uVar8 >> 0x30),0xe);
    auVar17 = vpinsrb_avx(auVar17,(uint)(byte)((ulong)uVar8 >> 0x38),0xf);
    auVar49._0_16_ = ZEXT116(0) * auVar16 + ZEXT116(1) * auVar17;
    auVar49._16_16_ = ZEXT116(1) * auVar16;
    bVar36 = auVar49 != _DAT_00130ac0;
    uStack_78 = (ulong)(auVar49 == _DAT_00130ac0);
    iVar22 = 0x32;
    if ((puVar30 != (uint8_t *)0x26) &&
       (puVar48 = (uint8_t *)(ulong)*(byte *)((long)&emitter_00->commit_message + 6),
       puVar48 <= puVar30 + -0x27 && puVar48 < (uint8_t *)0x21)) {
      puVar26 = (uint8_t *)((long)&emitter_00->buf + (long)puVar30);
      local_88 = (void *)((long)&emitter_00->commit_message + 7);
      puVar35 = (uint8_t *)((long)&emitter_00->buf + (long)puVar48);
      puStack_80 = puVar48;
      if (1 < (long)puVar26 - (long)(puVar35 + 0x27)) {
        pppVar32 = tls->ctx->cipher_suites;
        ppVar34 = *pppVar32;
        if (ppVar34 != (ptls_cipher_suite_t *)0x0) {
          uVar21 = *(ushort *)(puVar35 + 0x27);
          do {
            pppVar32 = pppVar32 + 1;
            if (ppVar34->id == (uint16_t)(uVar21 << 8 | uVar21 >> 8)) {
              tls->cipher_suite = ppVar34;
              if ((puVar35 + 0x29 == puVar26) || (puVar35[0x29] != '\0')) goto LAB_0011087c;
              if (bVar36) {
                local_100 = (uint8_t *)0x0;
              }
              else {
                puStack_70 = (uint8_t *)0xffff;
                local_100 = (uint8_t *)0xffff;
              }
              local_b0 = 0x240000112421;
              if ((ulong)((long)puVar26 - (long)(puVar35 + 0x2a)) < 2) goto LAB_001117ef;
              uVar27 = (ulong)(ushort)(*(ushort *)(puVar35 + 0x2a) << 8 |
                                      *(ushort *)(puVar35 + 0x2a) >> 8);
              puVar35 = puVar35 + 0x2c;
              if ((ulong)((long)puVar26 - (long)puVar35) < uVar27) goto LAB_001117ef;
              puVar47 = puVar35 + uVar27;
              local_e4 = 0xffff;
              local_48 = 0;
              local_b8 = (uint8_t *)0x0;
              local_102 = 0xffff;
              local_50 = puVar48;
              local_40 = local_88;
              goto LAB_0011190c;
            }
            ppVar34 = *pppVar32;
          } while (ppVar34 != (ptls_cipher_suite_t *)0x0);
        }
        tls->cipher_suite = (ptls_cipher_suite_t *)0x0;
LAB_0011087c:
        iVar22 = 0x2f;
      }
    }
    goto LAB_00110882;
  case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
    if (cVar4 != '\b') {
      return 10;
    }
    local_a8 = (undefined1  [8])0x83a0000002020;
    if ((((ulong)puVar30 & 0xfffffffffffffffe) == 4) ||
       (uVar21 = *(ushort *)((long)&emitter_00->buf + 4),
       puVar48 = (uint8_t *)(ulong)(ushort)(uVar21 << 8 | uVar21 >> 8), puVar30 + -6 < puVar48)) {
      return 0x32;
    }
    puVar26 = (uint8_t *)((long)&emitter_00->buf + 6);
    if (puVar48 == (uint8_t *)0x0) {
      local_e0 = (ptls_raw_extension_t *)client_handle_encrypted_extensions_no_unknown_extensions;
      local_c0 = (uint8_t *)0x0;
      bVar36 = false;
      local_f8 = (uint8_t *)0x0;
    }
    else {
      puVar48 = puVar48 + (long)puVar26;
      bVar36 = true;
      local_f8 = (uint8_t *)0x0;
      local_e0 = (ptls_raw_extension_t *)client_handle_encrypted_extensions_no_unknown_extensions;
      local_c0 = (uint8_t *)0x0;
      do {
        iVar23 = 0x32;
        iVar22 = iVar23;
        if ((long)puVar48 - (long)puVar26 < 2) goto LAB_001118a2;
        uVar6 = *puVar26;
        bVar19 = puVar26[1];
        uVar21 = CONCAT11(uVar6,bVar19);
        if (uVar21 < 0x40) {
          if (((byte)auStack_a0[(ulong)(uVar21 >> 3) - 8] >> (uVar21 & 7) & 1) == 0) {
            auStack_a0[(ulong)(bVar19 >> 3) - 8] =
                 auStack_a0[(ulong)(bVar19 >> 3) - 8] | '\x01' << (bVar19 & 7);
            goto LAB_00111005;
          }
LAB_00111462:
          iVar22 = 0x2f;
          goto LAB_001118a2;
        }
LAB_00111005:
        if ((ulong)((long)puVar48 - (long)(puVar26 + 2)) < 2) goto LAB_001118a2;
        uVar21 = *(ushort *)(puVar26 + 2) << 8 | *(ushort *)(puVar26 + 2) >> 8;
        uVar27 = (ulong)uVar21;
        ppVar44 = (ptls_raw_extension_t *)(puVar26 + 4);
        if ((ulong)((long)puVar48 - (long)ppVar44) < uVar27) goto LAB_001118a2;
        psVar10 = tls->ctx->on_extension;
        uVar20 = CONCAT11(uVar6,bVar19);
        uVar31 = (uint)uVar20;
        if ((psVar10 != (st_ptls_on_extension_t *)0x0) &&
           (pVar54.len._0_2_ = uVar21, pVar54.base = (uint8_t *)ppVar44, pVar54.len._2_6_ = 0,
           ppVar40 = ppVar44, iVar24 = (*psVar10->cb)(psVar10,tls,'\b',uVar20,pVar54), iVar24 != 0))
        {
          iVar22 = 1;
          goto LAB_001118a2;
        }
        puVar35 = puVar26 + 3 + uVar27 + 1;
        if (uVar31 < 0x14) {
          if (uVar31 == 0) {
            if (uVar27 != 0) goto LAB_001118a2;
            iVar22 = 0x2f;
            if (tls->server_name == (char *)0x0) goto LAB_001118a2;
            iVar23 = ptls_server_name_is_ipaddr(tls->server_name);
joined_r0x001111f3:
            if (iVar23 != 0) goto LAB_001118a2;
          }
          else if (uVar31 == 0x10) {
            if (uVar21 < 2) goto LAB_001118a2;
            uVar27 = (ulong)(ushort)(*(ushort *)(puVar26 + 4) << 8 | *(ushort *)(puVar26 + 4) >> 8);
            if (((ulong)((long)puVar35 - (long)(puVar26 + 6)) < uVar27) || (uVar27 == 0))
            goto LAB_001118a2;
            puVar47 = puVar26 + 6 + uVar27;
            uVar27 = (ulong)puVar26[6];
            puVar26 = puVar26 + 7;
            if (((ulong)((long)puVar47 - (long)puVar26) < uVar27) ||
               ((uVar27 == 0 ||
                (iVar22 = ptls_set_negotiated_protocol(tls,(char *)puVar26,uVar27), iVar22 != 0))))
            goto LAB_001118a2;
            if (puVar26 + uVar27 != puVar47) {
              iVar22 = 0x28;
              goto LAB_001118a2;
            }
            iVar22 = iVar23;
            if (puVar47 != puVar35) goto LAB_001118a2;
          }
          else {
LAB_001111fe:
            if ((properties != (ptls_handshake_properties_t *)0x0) &&
               (properties->collect_extension !=
                (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0)) {
              iVar22 = (*properties->collect_extension)(tls,properties,uVar20);
              if (iVar22 != 0) {
                if (local_e0 ==
                    (ptls_raw_extension_t *)client_handle_encrypted_extensions_no_unknown_extensions
                   ) {
                  local_e0 = (ptls_raw_extension_t *)malloc(0x198);
                  if (local_e0 == (ptls_raw_extension_t *)0x0) {
                    local_e0 = (ptls_raw_extension_t *)0x0;
                    iVar22 = 0x201;
                    goto LAB_001118a2;
                  }
                  local_e0->type = 0xffff;
                }
                iVar22 = collect_unknown_extension
                                   ((ptls_t *)(ulong)uVar31,(uint16_t)ppVar44,puVar35,
                                    (uint8_t *)local_e0,ppVar40);
                iVar23 = iVar22;
                goto joined_r0x001111f3;
              }
            }
          }
        }
        else if (uVar31 == 0x14) {
          if (uVar21 != 1) goto LAB_001118a2;
          local_c0 = (uint8_t *)CONCAT71((int7)((ulong)(puVar26 + 3) >> 8),(uint8_t)ppVar44->type);
        }
        else if (uVar31 == 0x2a) {
          if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) == 0) goto LAB_00111462;
          bVar36 = false;
        }
        else {
          if (uVar31 != 0xffce) goto LAB_001111fe;
          if ((uint8_t)ppVar44->type != '\0') {
            iVar22 = 0x208;
            goto LAB_001118a2;
          }
          if (uVar21 != 0x11) goto LAB_00111462;
          local_f8 = puVar26 + 5;
        }
        puVar26 = puVar35;
      } while (puVar35 != puVar48);
      bVar36 = !bVar36;
      puVar26 = puVar48;
    }
    iVar22 = 0x32;
    if (puVar26 == (uint8_t *)((long)&emitter_00->buf + (long)puVar30)) {
      iVar22 = 0x2b;
      if ((byte)local_c0 == ((byte)tls->ctx->field_0x70 >> 4 & 2)) {
        iVar22 = 0x2f;
        if (tls->esni == (ptls_esni_secret_t *)0x0) {
          if (local_f8 == (uint8_t *)0x0) goto LAB_00111484;
        }
        else if ((local_f8 != (uint8_t *)0x0) &&
                (iVar23 = (*ptls_mem_equal)(local_f8,tls->esni->nonce,0x10), iVar23 != 0)) {
          free_esni_secret(&tls->esni,0);
LAB_00111484:
          bVar19 = (tls->field_18).server.pending_traffic_secret[0x38];
          if ((bVar19 & 2) != 0) {
            if (bVar36 == false) {
              (tls->field_18).server.pending_traffic_secret[0x38] = bVar19 & 0xfd;
            }
            if (properties != (ptls_handshake_properties_t *)0x0) {
              (properties->field_0).client.early_data_acceptance = bVar36 + PTLS_EARLY_DATA_REJECTED
              ;
            }
          }
          iVar22 = report_unknown_extensions(tls,properties,local_e0);
          if (iVar22 == 0) {
            ppVar38 = tls->key_schedule;
            if (ppVar38->num_hashes != 0) {
              pppVar42 = &ppVar38->hashes[0].ctx;
              sVar37 = 0;
              do {
                (*(*pppVar42)->update)(*pppVar42,emitter_00,(size_t)puVar30);
                sVar37 = sVar37 + 1;
                pppVar42 = pppVar42 + 2;
              } while (sVar37 != ppVar38->num_hashes);
            }
            bVar19 = (tls->field_0x160 & 2) >> 1;
            tls->state = (uint)bVar19 + (uint)bVar19 * 2 +
                         PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE;
            iVar22 = 0x202;
          }
        }
      }
    }
LAB_001118a2:
    if (local_e0 == (ptls_raw_extension_t *)client_handle_encrypted_extensions_no_unknown_extensions
       ) {
      return iVar22;
    }
    goto LAB_00110f42;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
    if (cVar4 == '\v') {
LAB_00110e9f:
      iVar23 = handle_certificate(tls,(uint8_t *)((long)&emitter_00->buf + 4),
                                  (uint8_t *)((long)&emitter_00->buf + (long)puVar30),
                                  (int *)local_a8);
      iVar22 = 0x2f;
      if (local_a8._0_4_ != 0) {
        iVar22 = 0;
      }
      if (iVar23 != 0) {
        iVar22 = iVar23;
      }
      if (iVar22 == 0) {
        ppVar38 = tls->key_schedule;
        if (ppVar38->num_hashes != 0) {
          pppVar42 = &ppVar38->hashes[0].ctx;
          sVar37 = 0;
          do {
            (*(*pppVar42)->update)(*pppVar42,emitter_00,(size_t)puVar30);
            sVar37 = sVar37 + 1;
            pppVar42 = pppVar42 + 2;
          } while (sVar37 != ppVar38->num_hashes);
        }
        tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
        return 0x202;
      }
      return iVar22;
    }
    if (cVar4 != '\x19') {
      if (cVar4 != '\r') {
        return 10;
      }
      if (puVar30 == (uint8_t *)0x4) {
        return 0x32;
      }
      puVar48 = (uint8_t *)(ulong)*(byte *)((long)&emitter_00->buf + 4);
      if (puVar30 + -5 < puVar48) {
        return 0x32;
      }
      puVar26 = (uint8_t *)0x1;
      if (puVar48 != (uint8_t *)0x0) {
        puVar26 = puVar48;
      }
      puVar26 = (uint8_t *)malloc((size_t)puVar26);
      (tls->field_18).client.certificate_request.context.base = puVar26;
      if (puVar26 == (uint8_t *)0x0) {
        return 0x201;
      }
      ppVar40 = (ptls_raw_extension_t *)((long)&emitter_00->buf + (long)puVar30);
      __src = (void *)((long)&emitter_00->buf + 5);
      puVar2 = (ushort *)((long)__src + (long)puVar48);
      (tls->field_18).client.certificate_request.context.len = (size_t)puVar48;
      memcpy(puVar26,__src,(size_t)puVar48);
      local_d8.base = (uint8_t *)0x83e0000110401;
      if ((ulong)((long)ppVar40 - (long)puVar2) < 2) {
        return 0x32;
      }
      uVar27 = (ulong)(ushort)(*puVar2 << 8 | *puVar2 >> 8);
      ppVar44 = (ptls_raw_extension_t *)(puVar2 + 1);
      if ((ulong)((long)ppVar40 - (long)ppVar44) < uVar27) {
        return 0x32;
      }
      ppVar45 = ppVar44;
      if (uVar27 != 0) {
        ppVar45 = (ptls_raw_extension_t *)((long)&ppVar44->type + uVar27);
        do {
          if ((long)ppVar45 - (long)ppVar44 < 2) {
            return 0x32;
          }
          uVar5 = (undefined1)ppVar44->type;
          bVar19 = *(byte *)((long)&ppVar44->type + 1);
          uVar21 = CONCAT11(uVar5,bVar19);
          if (uVar21 < 0x40) {
            if ((*(byte *)((long)&local_d8.base + (ulong)(uVar21 >> 3)) >> (uVar21 & 7) & 1) != 0) {
              return 0x2f;
            }
            pbVar3 = (byte *)((long)&local_d8.base + (ulong)(bVar19 >> 3));
            *pbVar3 = *pbVar3 | '\x01' << (bVar19 & 7);
          }
          if ((ulong)((long)ppVar45 - (long)&ppVar44->field_0x2) < 2) {
            return 0x32;
          }
          uVar20 = *(ushort *)&ppVar44->field_0x2 << 8 | *(ushort *)&ppVar44->field_0x2 >> 8;
          puVar43 = &ppVar44->field_0x4;
          if ((ulong)((long)ppVar45 - (long)puVar43) < (ulong)uVar20) {
            return 0x32;
          }
          psVar10 = tls->ctx->on_extension;
          local_a8 = (undefined1  [8])puVar43;
          if ((psVar10 != (st_ptls_on_extension_t *)0x0) &&
             (pVar53.len._0_2_ = uVar20, pVar53.base = puVar43, pVar53.len._2_6_ = 0,
             iVar22 = (*psVar10->cb)(psVar10,tls,'\r',CONCAT11(uVar5,bVar19),pVar53), iVar22 != 0))
          {
            return 1;
          }
          ppVar44 = (ptls_raw_extension_t *)(puVar43 + uVar20);
          if ((uVar21 == 0xd) &&
             (iVar22 = decode_signature_algorithms
                                 (&(tls->field_18).client.certificate_request.signature_algorithms,
                                  (uint8_t **)local_a8,(uint8_t *)ppVar44), iVar22 != 0)) {
            return iVar22;
          }
          local_a8 = (undefined1  [8])ppVar44;
        } while (ppVar44 != ppVar45);
      }
      if (ppVar45 != ppVar40) {
        return 0x32;
      }
      if ((tls->field_18).client.certificate_request.signature_algorithms.count == 0) {
        return 0x6d;
      }
      if ((tls->field_18).client.certificate_request.context.len != 0) {
        return 0x2f;
      }
      tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE;
      ppVar38 = tls->key_schedule;
      if (ppVar38->num_hashes != 0) {
        pppVar42 = &ppVar38->hashes[0].ctx;
        sVar37 = 0;
        do {
          (*(*pppVar42)->update)(*pppVar42,emitter_00,(size_t)puVar30);
          sVar37 = sVar37 + 1;
          pppVar42 = pppVar42 + 2;
        } while (sVar37 != ppVar38->num_hashes);
        return 0x202;
      }
      return 0x202;
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
    if (cVar4 != '\x19') {
      if (cVar4 != '\v') {
        return 10;
      }
      goto LAB_00110e9f;
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
    if (cVar4 != '\x0f') {
      return 10;
    }
    iVar22 = handle_certificate_verify(tls,message,"TLS 1.3, server CertificateVerify");
    if (iVar22 == 0) {
      tls->state = PTLS_STATE_CLIENT_EXPECT_FINISHED;
      return 0x202;
    }
    return iVar22;
  case PTLS_STATE_CLIENT_EXPECT_FINISHED:
    if (is_end_of_record == 0 || cVar4 != '\x14') {
      return 10;
    }
    iVar22 = verify_finished(tls,message);
    if (iVar22 == 0) {
      ppVar38 = tls->key_schedule;
      if (ppVar38->num_hashes != 0) {
        pppVar42 = &ppVar38->hashes[0].ctx;
        sVar37 = 0;
        do {
          (*(*pppVar42)->update)(*pppVar42,emitter_00,(size_t)puVar30);
          sVar37 = sVar37 + 1;
          pppVar42 = pppVar42 + 2;
        } while (sVar37 != ppVar38->num_hashes);
        ppVar38 = tls->key_schedule;
      }
      iVar22 = key_schedule_extract(ppVar38,(ptls_iovec_t)ZEXT816(0));
      if ((((iVar22 == 0) &&
           (iVar22 = setup_traffic_protection(tls,0,"s ap traffic",3,0), iVar22 == 0)) &&
          (iVar22 = derive_secret(tls->key_schedule,local_a8,"c ap traffic"), iVar22 == 0)) &&
         (iVar22 = derive_exporter_secret(tls,0), iVar22 == 0)) {
        if (tls->pending_handshake_secret != (uint8_t *)0x0) {
          if (((tls->traffic_protection).enc.aead == (ptls_aead_context_t *)0x0) &&
             (tls->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0)) {
            __assert_fail("tls->traffic_protection.enc.aead != NULL || tls->ctx->update_traffic_key != NULL"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                          ,0xb84,
                          "int client_handle_finished(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t)"
                         );
          }
          bVar19 = (tls->field_18).server.pending_traffic_secret[0x38];
          if (((bVar19 & 2) != 0) && ((tls->ctx->field_0x70 & 0x10) == 0)) {
            iVar22 = (*emitter->begin_message)(emitter);
            if (iVar22 != 0) goto LAB_00110e28;
            buf = emitter->buf;
            ppVar38 = tls->key_schedule;
            sVar37 = buf->off;
            iVar22 = ptls_buffer_reserve(buf,1);
            if (iVar22 != 0) goto LAB_00110e28;
            buf->base[buf->off] = '\x05';
            buf->off = buf->off + 1;
            iVar22 = ptls_buffer_reserve(buf,3);
            if (iVar22 != 0) goto LAB_00110e28;
            puVar30 = buf->base;
            sVar12 = buf->off;
            puVar30[sVar12 + 2] = '\0';
            puVar30 = puVar30 + sVar12;
            puVar30[0] = '\0';
            puVar30[1] = '\0';
            sVar12 = buf->off;
            buf->off = sVar12 + 3;
            lVar28 = -3;
            do {
              buf->base[lVar28 + 3 + sVar12] = '\0';
              lVar28 = lVar28 + 1;
            } while (lVar28 != 0);
            if ((ppVar38 != (ptls_key_schedule_t *)0x0) && (ppVar38->num_hashes != 0)) {
              puVar30 = buf->base;
              sVar12 = buf->off;
              pppVar42 = &ppVar38->hashes[0].ctx;
              sVar46 = 0;
              do {
                (*(*pppVar42)->update)(*pppVar42,puVar30 + sVar37,sVar12 - sVar37);
                sVar46 = sVar46 + 1;
                pppVar42 = pppVar42 + 2;
              } while (sVar46 != ppVar38->num_hashes);
            }
            iVar22 = (*emitter->commit_message)(emitter);
            if (iVar22 != 0) goto LAB_00110e28;
            bVar19 = (tls->field_18).server.pending_traffic_secret[0x38];
          }
          (tls->field_18).server.pending_traffic_secret[0x38] = bVar19 & 0xfd;
          iVar22 = commission_handshake_secret(tls);
          if (iVar22 != 0) goto LAB_00110e28;
        }
        iVar22 = push_change_cipher_spec(tls,emitter);
        if (iVar22 == 0) {
          puVar30 = (tls->field_18).client.certificate_request.context.base;
          if (puVar30 != (uint8_t *)0x0) {
            iVar22 = 0x2f;
            if ((tls->field_0x160 & 2) != 0) goto LAB_00110e28;
            context.len = (tls->field_18).client.certificate_request.context.len;
            context.base = puVar30;
            iVar22 = send_certificate_and_certificate_verify
                               (tls,emitter,
                                &(tls->field_18).client.certificate_request.signature_algorithms,
                                context,"TLS 1.3, client CertificateVerify",0,(uint16_t *)0x0,0);
            free((tls->field_18).client.certificate_request.context.base);
            *(uint8_t **)((long)&tls->field_18 + 0x40) = (uint8_t *)0x0;
            *(size_t *)((long)&tls->field_18 + 0x48) = 0;
            if (iVar22 != 0) goto LAB_00110e28;
          }
          send_finished(tls,emitter);
          *(undefined1 (*) [8])(tls->traffic_protection).enc.secret = local_a8;
          *(undefined8 *)((tls->traffic_protection).enc.secret + 8) = auStack_a0._0_8_;
          *(undefined8 *)((tls->traffic_protection).enc.secret + 0x10) = auStack_a0._8_8_;
          *(ulong *)((tls->traffic_protection).enc.secret + 0x18) = uStack_90;
          *(void **)((tls->traffic_protection).enc.secret + 0x20) = local_88;
          *(uint8_t **)((tls->traffic_protection).enc.secret + 0x28) = puStack_80;
          *(ulong *)((tls->traffic_protection).enc.secret + 0x30) = uStack_78;
          *(uint8_t **)((tls->traffic_protection).enc.secret + 0x38) = puStack_70;
          iVar22 = setup_traffic_protection(tls,1,(char *)0x0,3,0);
          if (iVar22 == 0) {
            tls->state = PTLS_STATE_CLIENT_POST_HANDSHAKE;
            iVar22 = 0;
          }
        }
      }
    }
LAB_00110e28:
    (*ptls_clear_memory)(local_a8,0x40);
    return iVar22;
  default:
    goto switchD_001105fb_caseD_8;
  case PTLS_STATE_CLIENT_POST_HANDSHAKE:
    if (cVar4 == '\x18') {
      message_00.base = puVar30;
      iVar22 = handle_key_update(tls,emitter_00,message_00);
      return iVar22;
    }
    if (cVar4 != '\x04') {
      return 10;
    }
    puVar48 = (uint8_t *)((long)&emitter_00->buf + 4);
    iVar22 = decode_new_session_ticket
                       (tls,(uint32_t *)&local_b0,&local_34,&local_d8,(ptls_iovec_t *)local_a8,
                        &local_38,puVar48,(uint8_t *)((long)&emitter_00->buf + (long)puVar30));
    if (iVar22 != 0) {
      return iVar22;
    }
    if (tls->ctx->save_ticket == (ptls_save_ticket_t *)0x0) {
      return 0;
    }
    local_a8 = (undefined1  [8])0x13a723;
    auStack_a0 = (undefined1  [16])0x0;
    uStack_90 = uStack_90 & 0xffffffff00000000;
    psVar9 = tls->ctx->get_time;
    uVar25 = (*psVar9->cb)(psVar9);
    iVar22 = ptls_buffer_reserve((ptls_buffer_t *)local_a8,8);
    sVar37 = auStack_a0._8_8_;
    local_e0 = (ptls_raw_extension_t *)local_a8;
    if (iVar22 == 0) {
      *(uint64_t *)((long)(uint16_t *)local_a8 + auStack_a0._8_8_) =
           uVar25 >> 0x38 | (uVar25 & 0xff000000000000) >> 0x28 | (uVar25 & 0xff0000000000) >> 0x18
           | (uVar25 & 0xff00000000) >> 8 | (uVar25 & 0xff000000) << 8 | (uVar25 & 0xff0000) << 0x18
           | (uVar25 & 0xff00) << 0x28 | uVar25 << 0x38;
      auStack_a0._8_8_ = auStack_a0._8_8_ + 8;
      uVar21 = tls->key_share->id;
      iVar22 = ptls_buffer_reserve((ptls_buffer_t *)local_a8,2);
      sVar37 = auStack_a0._8_8_;
      local_e0 = (ptls_raw_extension_t *)local_a8;
      if (iVar22 == 0) {
        *(ushort *)((long)(uint16_t *)local_a8 + auStack_a0._8_8_) = uVar21 << 8 | uVar21 >> 8;
        auStack_a0._8_8_ = auStack_a0._8_8_ + 2;
        uVar21 = tls->cipher_suite->id;
        iVar22 = ptls_buffer_reserve((ptls_buffer_t *)local_a8,2);
        sVar37 = auStack_a0._8_8_;
        local_e0 = (ptls_raw_extension_t *)local_a8;
        if (iVar22 == 0) {
          *(ushort *)((long)(uint16_t *)local_a8 + auStack_a0._8_8_) = uVar21 << 8 | uVar21 >> 8;
          auStack_a0._8_8_ = auStack_a0._8_8_ + 2;
          iVar22 = ptls_buffer_reserve((ptls_buffer_t *)local_a8,3);
          uVar7 = auStack_a0._8_8_;
          sVar37 = auStack_a0._8_8_;
          local_e0 = (ptls_raw_extension_t *)local_a8;
          if (iVar22 == 0) {
            ((undefined1 *)((long)local_a8 + 2))[auStack_a0._8_8_] = 0;
            *(undefined2 *)((long)(uint16_t *)local_a8 + auStack_a0._8_8_) = 0;
            lVar28 = auStack_a0._8_8_ + 3;
            auStack_a0._8_8_ = lVar28;
            iVar22 = ptls_buffer__do_pushv((ptls_buffer_t *)local_a8,puVar48,(size_t)(puVar30 + -4))
            ;
            sVar37 = auStack_a0._8_8_;
            local_e0 = (ptls_raw_extension_t *)local_a8;
            if (iVar22 == 0) {
              lVar28 = auStack_a0._8_8_ - lVar28;
              *(char *)((long)(uint16_t *)local_a8 + uVar7) = (char)((ulong)lVar28 >> 0x10);
              *(char *)((long)(uint16_t *)local_a8 + uVar7 + 1) = (char)((ulong)lVar28 >> 8);
              ((undefined1 *)((long)local_a8 + 2))[uVar7] = (char)lVar28;
              iVar22 = ptls_buffer_reserve((ptls_buffer_t *)local_a8,2);
              uVar7 = auStack_a0._8_8_;
              sVar37 = auStack_a0._8_8_;
              local_e0 = (ptls_raw_extension_t *)local_a8;
              if (iVar22 == 0) {
                *(undefined2 *)((long)(uint16_t *)local_a8 + auStack_a0._8_8_) = 0;
                lVar28 = auStack_a0._8_8_ + 2;
                auStack_a0._8_8_ = lVar28;
                iVar22 = ptls_buffer_reserve((ptls_buffer_t *)local_a8,
                                             (tls->key_schedule->hashes[0].algo)->digest_size);
                local_e0 = (ptls_raw_extension_t *)local_a8;
                sVar37 = auStack_a0._8_8_;
                if ((iVar22 == 0) &&
                   (iVar22 = derive_resumption_secret
                                       (tls->key_schedule,
                                        (uint8_t *)((long)(uint16_t *)local_a8 + auStack_a0._8_8_),
                                        local_d8), iVar22 == 0)) {
                  sVar37 = sVar37 + (tls->key_schedule->hashes[0].algo)->digest_size;
                  uVar21 = (short)sVar37 - (short)lVar28;
                  *(ushort *)((long)&local_e0->type + uVar7) = uVar21 * 0x100 | uVar21 >> 8;
                  psVar13 = tls->ctx->save_ticket;
                  pVar52.len = sVar37;
                  pVar52.base = (uint8_t *)local_e0;
                  iVar22 = (*psVar13->cb)(psVar13,tls,pVar52);
                }
              }
            }
          }
        }
      }
    }
    (*ptls_clear_memory)(local_e0,sVar37);
    if ((int)uStack_90 == 0) {
      return iVar22;
    }
    goto LAB_00110f42;
  }
  psVar11 = tls->ctx->decompress_certificate;
  if (psVar11 == (st_ptls_decompress_certificate_t *)0x0) {
    iVar22 = 10;
  }
  else {
    iVar22 = 0x32;
    iVar23 = 0x32;
    if ((5 < (long)puVar30) && ((uint8_t *)0x8 < puVar30)) {
      uVar31 = (uint)*(byte *)&emitter_00->enc |
               (uint)*(byte *)((long)&emitter_00->buf + 7) << 8 |
               (uint)*(byte *)((long)&emitter_00->buf + 6) << 0x10;
      if (uVar31 < 0x10001) {
        uVar21 = *(ushort *)((long)&emitter_00->buf + 4);
        local_e0 = (ptls_raw_extension_t *)malloc((ulong)uVar31);
        if (local_e0 != (ptls_raw_extension_t *)0x0) {
          iVar22 = iVar23;
          if ((uint8_t *)0x2 < puVar30 + -9) {
            lVar28 = 9;
            puVar48 = (uint8_t *)0x0;
            do {
              puVar48 = (uint8_t *)
                        ((ulong)*(byte *)((long)&emitter_00->buf + lVar28) | (long)puVar48 << 8);
              lVar28 = lVar28 + 1;
            } while (lVar28 != 0xc);
            if (puVar48 <= puVar30 + -0xc) {
              ppVar40 = (ptls_raw_extension_t *)((long)&emitter_00->enc + 4);
              auStack_a0._0_8_ = puVar48;
              pVar18.len = (size_t)puVar48;
              pVar18.base = (uint8_t *)ppVar40;
              pVar50.len._0_4_ = uVar31;
              pVar50.base = (uint8_t *)local_e0;
              pVar50.len._4_4_ = 0;
              local_a8 = (undefined1  [8])ppVar40;
              iVar22 = (*psVar11->cb)(psVar11,tls,uVar21 << 8 | uVar21 >> 8,pVar50,pVar18);
              if ((iVar22 == 0) &&
                 (iVar22 = iVar23,
                 (uint8_t *)((long)&ppVar40->type + (long)puVar48) ==
                 (uint8_t *)((long)&emitter_00->buf + (long)puVar30))) {
                iVar23 = handle_certificate(tls,(uint8_t *)local_e0,
                                            (uint8_t *)((long)&local_e0->type + (ulong)uVar31),
                                            (int *)&local_d8);
                iVar22 = 0x2f;
                if ((int)local_d8.base != 0) {
                  iVar22 = 0;
                }
                if (iVar23 != 0) {
                  iVar22 = iVar23;
                }
                if (iVar22 == 0) {
                  ppVar38 = tls->key_schedule;
                  if (ppVar38->num_hashes != 0) {
                    pppVar42 = &ppVar38->hashes[0].ctx;
                    sVar37 = 0;
                    do {
                      (*(*pppVar42)->update)(*pppVar42,emitter_00,(size_t)puVar30);
                      sVar37 = sVar37 + 1;
                      pppVar42 = pppVar42 + 2;
                    } while (sVar37 != ppVar38->num_hashes);
                  }
                  tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
                  iVar22 = 0x202;
                }
              }
            }
          }
          goto LAB_00110f42;
        }
        iVar22 = 0x201;
      }
      else {
        iVar22 = 0x2a;
      }
    }
  }
  local_e0 = (ptls_raw_extension_t *)0x0;
  goto LAB_00110f42;
LAB_0011190c:
  if (puVar35 == puVar47) {
    local_68.len = local_48;
    iVar22 = 0x32;
    if (puVar47 != puVar26) goto LAB_00110882;
    lVar28 = 0;
    goto LAB_00111cb5;
  }
  if ((long)puVar47 - (long)puVar35 < 2) goto LAB_001117ef;
  uVar6 = *puVar35;
  bVar19 = puVar35[1];
  uVar21 = CONCAT11(uVar6,bVar19);
  if (uVar21 < 0x40) {
    if ((*(byte *)((long)&local_b0 + (ulong)(uVar21 >> 3)) >> (uVar21 & 7) & 1) != 0)
    goto LAB_0011087c;
    pbVar3 = (byte *)((long)&local_b0 + (ulong)(bVar19 >> 3));
    *pbVar3 = *pbVar3 | '\x01' << (bVar19 & 7);
  }
  if ((ulong)((long)puVar47 - (long)(puVar35 + 2)) < 2) goto LAB_001117ef;
  uVar21 = *(ushort *)(puVar35 + 2) << 8 | *(ushort *)(puVar35 + 2) >> 8;
  puVar48 = puVar35 + 4;
  if ((ulong)((long)puVar47 - (long)puVar48) < (ulong)uVar21) goto LAB_001117ef;
  psVar10 = tls->ctx->on_extension;
  uVar20 = CONCAT11(uVar6,bVar19);
  puVar39 = puVar35;
  if ((psVar10 != (st_ptls_on_extension_t *)0x0) &&
     (pVar55.len._0_2_ = uVar21, pVar55.base = puVar48, pVar55.len._2_6_ = 0, local_c0 = puVar35,
     iVar22 = (*psVar10->cb)(psVar10,tls,'\x02',uVar20,pVar55), puVar39 = local_c0, iVar22 != 0)) {
    iVar22 = 1;
    goto LAB_00110882;
  }
  puVar35 = puVar48 + uVar21;
  puVar48 = puVar35;
  if (uVar20 < 0x2c) {
    if (uVar20 == 0x29) {
      if (!bVar36) goto LAB_0011087c;
      if (uVar21 < 2) goto LAB_001117ef;
      local_102 = *(ushort *)(puVar39 + 4) << 8 | *(ushort *)(puVar39 + 4) >> 8;
    }
    else {
      if (uVar20 != 0x2b) goto LAB_00111b94;
      if (uVar21 < 2) goto LAB_001117ef;
      local_e4 = *(ushort *)(puVar39 + 4) << 8 | *(ushort *)(puVar39 + 4) >> 8;
    }
    puVar48 = puVar39 + 6;
  }
  else if (uVar20 == 0x2c) {
    if (bVar36) goto LAB_0011087c;
    if (uVar21 < 2) goto LAB_001117ef;
    uVar27 = (ulong)(ushort)(*(ushort *)(puVar39 + 4) << 8 | *(ushort *)(puVar39 + 4) >> 8);
    puVar39 = puVar39 + 6;
    if (((ulong)((long)puVar35 - (long)puVar39) <= uVar27 - 1) ||
       (local_b8 = puVar39, local_68.base = puVar39, local_48 = uVar27, puVar39 + uVar27 != puVar35)
       ) goto LAB_001117ef;
  }
  else if (uVar20 == 0x33) {
    if (bVar36) {
      if ((uVar21 < 2) || (puVar35 + (-6 - (long)puVar39) < (uint8_t *)0x2)) goto LAB_001117ef;
      local_100 = puVar39 + 8;
      puVar41 = (uint8_t *)
                (ulong)(ushort)(*(ushort *)(puVar39 + 6) << 8 | *(ushort *)(puVar39 + 6) >> 8);
      if ((puVar35 + -(long)local_100 < puVar41) ||
         (local_b8 = puVar41, puStack_70 = local_100, local_68.base = puVar41,
         local_100 + (long)puVar41 != puVar35)) goto LAB_001117ef;
      iVar22 = 0x2f;
      if ((tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) ||
         (tls->key_share->id !=
          (uint16_t)(*(ushort *)(puVar39 + 4) << 8 | *(ushort *)(puVar39 + 4) >> 8)))
      goto LAB_00110882;
    }
    else {
      if (uVar21 < 2) goto LAB_001117ef;
      uVar21 = *(ushort *)(puVar39 + 4) << 8 | *(ushort *)(puVar39 + 4) >> 8;
      local_100 = (uint8_t *)(ulong)uVar21;
      puStack_70 = (uint8_t *)CONCAT62(puStack_70._2_6_,uVar21);
      puVar48 = puVar39 + 6;
    }
  }
LAB_00111b94:
  if (puVar48 != puVar35) goto LAB_001117ef;
  goto LAB_0011190c;
LAB_00111cb5:
  if (*(ushort *)((long)supported_versions + lVar28) != local_e4) goto code_r0x00111cbb;
  if (bVar36) {
    if (local_102 != 0xffff) {
      if ((local_102 != 0) || (((tls->field_18).server.pending_traffic_secret[0x38] & 1) == 0))
      goto LAB_0011087c;
      tls->field_0x160 = tls->field_0x160 | 2;
    }
    local_100._0_2_ = (uint16_t)puStack_70;
    if ((puStack_70 == (uint8_t *)0x0) && ((tls->field_0x160 & 2) == 0)) goto LAB_0011087c;
  }
  if ((uint8_t *)(tls->field_18).client.legacy_session_id.len == local_50) {
    iVar23 = (*ptls_mem_equal)(local_40,(tls->field_18).client.legacy_session_id.base,
                               (size_t)local_50);
    iVar22 = 0x2f;
    if (iVar23 != 0) {
      uVar31 = 0;
      if (bVar36) {
        if (((tls->field_18).server.pending_traffic_secret[0x38] & 1) != 0) {
          uVar31 = (uint)((tls->field_0x160 & 2) == 0);
        }
        iVar22 = key_schedule_select_one(tls->key_schedule,tls->cipher_suite,uVar31);
        if ((iVar22 == 0) &&
           ((puStack_70 == (uint8_t *)0x0 ||
            (pVar51.len = (size_t)local_b8, pVar51.base = puStack_70,
            iVar22 = (*((tls->field_18).client.key_share_ctx)->on_exchange)
                               (&(tls->field_18).client.key_share_ctx,1,&local_d8,pVar51),
            iVar22 == 0)))) {
          ppVar38 = tls->key_schedule;
          if (ppVar38->num_hashes != 0) {
            pppVar42 = &ppVar38->hashes[0].ctx;
            sVar37 = 0;
            do {
              (*(*pppVar42)->update)(*pppVar42,emitter_00,(size_t)puVar30);
              sVar37 = sVar37 + 1;
              pppVar42 = pppVar42 + 2;
            } while (sVar37 != ppVar38->num_hashes);
            ppVar38 = tls->key_schedule;
          }
          iVar22 = key_schedule_extract(ppVar38,local_d8);
          if ((iVar22 == 0) &&
             (iVar22 = setup_traffic_protection(tls,0,"s hs traffic",2,0), iVar22 == 0)) {
            if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) == 0) {
              iVar22 = setup_traffic_protection(tls,1,"c hs traffic",2,0);
LAB_00111ef2:
              if (iVar22 == 0) {
LAB_00111ef6:
                tls->state = PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS;
                iVar22 = 0x202;
              }
            }
            else {
              puVar30 = (uint8_t *)malloc(0x40);
              tls->pending_handshake_secret = puVar30;
              if (puVar30 == (uint8_t *)0x0) {
                iVar22 = 0x201;
              }
              else {
                iVar22 = derive_secret(tls->key_schedule,puVar30,"c hs traffic");
                if (iVar22 == 0) {
                  psVar15 = tls->ctx->update_traffic_key;
                  if (psVar15 != (st_ptls_update_traffic_key_t *)0x0) {
                    iVar22 = (*psVar15->cb)(psVar15,tls,1,2,tls->pending_handshake_secret);
                    goto LAB_00111ef2;
                  }
                  goto LAB_00111ef6;
                }
              }
            }
          }
        }
      }
      else {
        iVar22 = key_schedule_select_one(tls->key_schedule,tls->cipher_suite,0);
        if (iVar22 == 0) {
          ppVar14 = (tls->field_18).client.key_share_ctx;
          if (ppVar14 != (ptls_key_exchange_context_t *)0x0) {
            pppVar1 = &(tls->field_18).client.key_share_ctx;
            (*ppVar14->on_exchange)(pppVar1,1,(ptls_iovec_t *)0x0,(ptls_iovec_t)ZEXT816(0));
            *pppVar1 = (ptls_key_exchange_context_t *)0x0;
          }
          bVar19 = (tls->field_18).server.pending_traffic_secret[0x38];
          if ((bVar19 & 2) != 0) {
            if (tls->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0) {
              __ptr = (tls->traffic_protection).enc.aead;
              if (__ptr == (st_ptls_aead_context_t *)0x0) {
                __assert_fail("tls->traffic_protection.enc.aead != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                              ,0x912,
                              "int handle_hello_retry_request(ptls_t *, ptls_message_emitter_t *, struct st_ptls_server_hello_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                             );
              }
              (*__ptr->dispose_crypto)(__ptr);
              free(__ptr);
              (tls->traffic_protection).enc.aead = (ptls_aead_context_t *)0x0;
              bVar19 = (tls->field_18).server.pending_traffic_secret[0x38];
            }
            (tls->field_18).server.pending_traffic_secret[0x38] = bVar19 & 0xfd;
          }
          if ((uint16_t)local_100 == 0xffff) {
            if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
              return 0x2f;
            }
          }
          else {
            pppVar29 = tls->ctx->key_exchanges;
            ppVar33 = *pppVar29;
            if (ppVar33 == (ptls_key_exchange_algorithm_t *)0x0) {
              return 0x2f;
            }
            while (pppVar29 = pppVar29 + 1, ppVar33->id != (uint16_t)local_100) {
              ppVar33 = *pppVar29;
              if (ppVar33 == (ptls_key_exchange_algorithm_t *)0x0) {
                return 0x2f;
              }
            }
            tls->key_share = ppVar33;
          }
          key_schedule_transform_post_ch1hash(tls->key_schedule);
          ppVar38 = tls->key_schedule;
          if (ppVar38->num_hashes != 0) {
            pppVar42 = &ppVar38->hashes[0].ctx;
            sVar37 = 0;
            do {
              (*(*pppVar42)->update)(*pppVar42,emitter_00,(size_t)puVar30);
              sVar37 = sVar37 + 1;
              pppVar42 = pppVar42 + 2;
            } while (sVar37 != ppVar38->num_hashes);
          }
          iVar22 = send_client_hello(tls,emitter,properties,&local_68);
          return iVar22;
        }
      }
    }
    goto LAB_00110882;
  }
  goto LAB_0011087c;
code_r0x00111cbb:
  lVar28 = lVar28 + 2;
  if (lVar28 == 8) goto LAB_0011087c;
  goto LAB_00111cb5;
LAB_001117ef:
  iVar22 = 0x32;
LAB_00110882:
  if (local_d8.base == (uint8_t *)0x0) {
    return iVar22;
  }
  (*ptls_clear_memory)(local_d8.base,local_d8.len);
  local_e0 = (ptls_raw_extension_t *)local_d8.base;
LAB_00110f42:
  free(local_e0);
  return iVar22;
}

Assistant:

static int handle_client_handshake_message(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message, int is_end_of_record,
                                           ptls_handshake_properties_t *properties)
{
    uint8_t type = message.base[0];
    int ret;

    switch (tls->state) {
    case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
    case PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_SERVER_HELLO && is_end_of_record) {
            ret = client_handle_hello(tls, emitter, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
        if (type == PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS) {
            ret = client_handle_encrypted_extensions(tls, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_REQUEST) {
            ret = client_handle_certificate_request(tls, message, properties);
            break;
        }
    /* fall through */
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_CERTIFICATE:
            ret = client_handle_certificate(tls, message);
            break;
        case PTLS_HANDSHAKE_TYPE_COMPRESSED_CERTIFICATE:
            ret = client_handle_compressed_certificate(tls, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = client_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED && is_end_of_record) {
            ret = client_handle_finished(tls, emitter, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET:
            ret = client_handle_new_session_ticket(tls, message);
            break;
        case PTLS_HANDSHAKE_TYPE_KEY_UPDATE:
            ret = handle_key_update(tls, emitter, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    default:
        assert(!"unexpected state");
        ret = PTLS_ALERT_INTERNAL_ERROR;
        break;
    }

    PTLS_PROBE(RECEIVE_MESSAGE, tls, message.base[0], message.base + PTLS_HANDSHAKE_HEADER_SIZE,
               message.len - PTLS_HANDSHAKE_HEADER_SIZE, ret);

    return ret;
}